

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void test_master_table_dictionary_create_delete_all_2(planck_unit_test_t *tc)

{
  test_master_table_dictionary_create_delete(tc,0,dictionary_type_bpp_tree_t);
  test_master_table_dictionary_create_delete(tc,0x1e,dictionary_type_flat_file_t);
  test_master_table_dictionary_create_delete(tc,0x32,dictionary_type_open_address_hash_t);
  test_master_table_dictionary_create_delete(tc,0x32,dictionary_type_open_address_file_hash_t);
  test_master_table_dictionary_create_delete(tc,7,dictionary_type_skip_list_t);
  test_master_table_dictionary_create_delete(tc,7,dictionary_type_linear_hash_t);
  return;
}

Assistant:

void
test_master_table_dictionary_create_delete_all_2(
	planck_unit_test_t *tc
) {
	test_master_table_dictionary_create_delete(tc, 0, dictionary_type_bpp_tree_t);

	test_master_table_dictionary_create_delete(tc, 30, dictionary_type_flat_file_t);

	test_master_table_dictionary_create_delete(tc, 50, dictionary_type_open_address_hash_t);

	test_master_table_dictionary_create_delete(tc, 50, dictionary_type_open_address_file_hash_t);

	test_master_table_dictionary_create_delete(tc, 7, dictionary_type_skip_list_t);

	test_master_table_dictionary_create_delete(tc, 7, dictionary_type_linear_hash_t);
}